

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>
::InnerMap::clear(InnerMap *this)

{
  Node *pNVar1;
  LogMessage *other;
  void **ppvVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong uVar5;
  Node *node;
  const_iterator __position;
  LogFinisher local_71;
  ulong local_70;
  LogMessage local_68;
  
  if (this->num_buckets_ == 0) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      ppvVar2 = this->table_;
      node = (Node *)ppvVar2[uVar5];
      if (node != (Node *)0x0) {
        if (node == (Node *)ppvVar2[uVar5 ^ 1]) {
          if (((uVar5 & 1) != 0) || (node != (Node *)ppvVar2[uVar5 + 1])) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                       ,0x1fe);
            other = internal::LogMessage::operator<<
                              (&local_68,
                               "CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ");
            internal::LogFinisher::operator=(&local_71,other);
            internal::LogMessage::~LogMessage(&local_68);
            ppvVar2 = this->table_;
          }
          local_70 = uVar5 + 1;
          ppvVar2[uVar5 + 1] = (void *)0x0;
          this->table_[uVar5] = (void *)0x0;
          __position._M_node =
               (((_Rb_tree_impl<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::InnerMap::KeyCompare,_true>
                  *)&node->kv)->super__Rb_tree_header)._M_header._M_left;
          do {
            pNVar1 = *(Node **)(__position._M_node + 1);
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                            *)node,__position);
            DestroyNode(this,pNVar1);
            __position._M_node = p_Var3;
          } while ((_Rb_tree_header *)p_Var3 !=
                   &((_Rb_tree_impl<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>::InnerMap::KeyCompare,_true>
                      *)&node->kv)->super__Rb_tree_header);
          DestroyTree(this,(Tree *)node);
          uVar5 = local_70;
        }
        else {
          ppvVar2[uVar5] = (void *)0x0;
          do {
            pNVar1 = node->next;
            DestroyNode(this,node);
            node = pNVar1;
          } while (pNVar1 != (Node *)0x0);
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = this->num_buckets_;
    } while (uVar5 < uVar4);
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = uVar4;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }